

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O2

string * __thiscall
miniros::network::NetAddress::str_abi_cxx11_(string *__return_storage_ptr__,NetAddress *this)

{
  ostream *this_00;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,(string *)&this->address);
  if (this->port != 0) {
    this_00 = std::operator<<(local_190,":");
    std::ostream::operator<<((ostream *)this_00,this->port);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string NetAddress::str() const
{
  std::stringstream ss;
  ss << address;
  if (port) {
    ss << ":" << port;
  }
  return ss.str();
}